

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fLayoutBindingTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::LayoutBindingRenderCase::drawAndVerifyResult
          (LayoutBindingRenderCase *this,Vec4 *expectedColor)

{
  ostringstream *poVar1;
  RenderContext *context;
  bool bVar2;
  int iVar3;
  int iVar4;
  RGBA RVar5;
  uint uVar6;
  deUint32 dVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  RGBA compareThreshold;
  Surface result;
  Surface reference;
  undefined1 local_1a8 [384];
  long lVar8;
  
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  iVar3 = getRenderWidth(this);
  iVar4 = getRenderHeight(this);
  tcu::Surface::Surface(&reference,iVar3,iVar4);
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[4])();
  RVar5 = tcu::PixelFormat::getColorThreshold((PixelFormat *)(CONCAT44(extraout_var_00,iVar3) + 8));
  uVar9 = (RVar5.m_value & 0xff) * 2;
  if (0xfe < uVar9) {
    uVar9 = 0xff;
  }
  uVar10 = RVar5.m_value >> 7 & 0x1fe;
  if (0xfe < uVar10) {
    uVar10 = 0xff;
  }
  uVar11 = RVar5.m_value >> 0xf & 0x1fe;
  if (0xfe < uVar11) {
    uVar11 = 0xff;
  }
  uVar6 = RVar5.m_value >> 0x17 & 0xfffffffe;
  if (0xfe < uVar6) {
    uVar6 = 0xff;
  }
  compareThreshold.m_value = uVar11 << 0x10 | uVar6 << 0x18 | uVar10 << 8 | uVar9;
  (**(code **)(lVar8 + 0x188))(0x4000);
  (**(code **)(lVar8 + 0x568))(4,6,0x1403,0);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"Drawing failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x283);
  iVar3 = getRenderWidth(this);
  iVar4 = getRenderHeight(this);
  tcu::Surface::Surface(&result,iVar3,iVar4);
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Reading pixels");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  tcu::Surface::getAccess((PixelBufferAccess *)local_1a8,&result);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1a8);
  dVar7 = (**(code **)(lVar8 + 0x800))();
  glu::checkError(dVar7,"Read pixels failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fLayoutBindingTests.cpp"
                  ,0x289);
  tcu::Surface::getAccess((PixelBufferAccess *)local_1a8,&reference);
  tcu::clear((PixelBufferAccess *)local_1a8,expectedColor);
  local_1a8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"Verifying output image, fragment output color is ");
  tcu::operator<<((ostream *)poVar1,expectedColor);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  bVar2 = tcu::pixelThresholdCompare
                    (((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                     "Render result","Result verification",&reference,&result,&compareThreshold,
                     COMPARE_LOG_RESULT);
  tcu::Surface::~Surface(&result);
  tcu::Surface::~Surface(&reference);
  return bVar2;
}

Assistant:

bool LayoutBindingRenderCase::drawAndVerifyResult (const Vec4& expectedColor)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	tcu::Surface			reference			(getRenderWidth(), getRenderHeight());

	// the point of these test is to check layout_binding. For this purpose, we can use quite
	// large thresholds.
	const tcu::RGBA			surfaceThreshold	= m_context.getRenderContext().getRenderTarget().getPixelFormat().getColorThreshold();
	const tcu::RGBA			compareThreshold	= tcu::RGBA(de::clamp(2 * surfaceThreshold.getRed(),   0, 255),
															de::clamp(2 * surfaceThreshold.getGreen(), 0, 255),
															de::clamp(2 * surfaceThreshold.getBlue(),  0, 255),
															de::clamp(2 * surfaceThreshold.getAlpha(), 0, 255));

	gl.clear(GL_COLOR_BUFFER_BIT);

	// Draw
	gl.drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, DE_NULL);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Drawing failed");

	// Verify
	tcu::Surface result(getRenderWidth(), getRenderHeight());
	m_testCtx.getLog() << TestLog::Message << "Reading pixels" << TestLog::EndMessage;
	glu::readPixels(m_context.getRenderContext(), 0, 0, result.getAccess());
	GLU_EXPECT_NO_ERROR(gl.getError(), "Read pixels failed");

	tcu::clear(reference.getAccess(), expectedColor);
	m_testCtx.getLog() << tcu::TestLog::Message << "Verifying output image, fragment output color is " << expectedColor << tcu::TestLog::EndMessage;

	return tcu::pixelThresholdCompare(m_testCtx.getLog(), "Render result", "Result verification", reference, result, compareThreshold, tcu::COMPARE_LOG_RESULT);
}